

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::textarea::textarea(textarea *this)

{
  base_widget::base_widget((base_widget *)&(this->super_base_text).field_0x58);
  (this->super_base_text).value_._M_dataplus._M_p = (pointer)&(this->super_base_text).value_.field_2
  ;
  (this->super_base_text).value_._M_string_length = 0;
  (this->super_base_text).value_.field_2._M_local_buf[0] = '\0';
  (this->super_base_text).low_ = 0;
  (this->super_base_text).high_ = -1;
  (this->super_base_text).validate_charset_ = true;
  (this->super_base_text).d.ptr_ = (_data *)0x0;
  (this->super_base_text)._vptr_base_text = (_func_int **)0x289a60;
  *(undefined8 *)&(this->super_base_text).field_0x58 = 0x289ae0;
  *(undefined8 *)&(this->super_base_text).field_0x48 = 0xffffffffffffffff;
  *(undefined8 *)&(this->super_base_text).field_0x50 = 0;
  return;
}

Assistant:

textarea::textarea() : rows_(-1), cols_(-1) {}